

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceBindingBase.hpp
# Opt level: O0

Uint32 __thiscall
Diligent::ShaderResourceBindingBase<Diligent::EngineGLImplTraits>::GetVariableCount
          (ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this,SHADER_TYPE ShaderType)

{
  undefined *puVar1;
  bool bVar2;
  Int32 IVar3;
  uint uVar4;
  Uint32 UVar5;
  PipelineResourceSignatureGLImpl *this_00;
  PipelineResourceSignatureDesc *Args_4;
  undefined8 uVar6;
  const_reference pvVar7;
  Char *Message;
  char (*in_stack_ffffffffffffff58) [3];
  undefined1 local_88 [8];
  string msg;
  int MgrInd;
  Int32 ShaderInd;
  char *local_50;
  Char *local_48;
  undefined1 local_40 [8];
  string _msg;
  PIPELINE_TYPE PipelineType;
  SHADER_TYPE ShaderType_local;
  ShaderResourceBindingBase<Diligent::EngineGLImplTraits> *this_local;
  
  _msg.field_2._12_4_ = ShaderType;
  _msg.field_2._M_local_buf[0xb] = GetPipelineType(this);
  bVar2 = IsConsistentShaderType(_msg.field_2._12_4_,_msg.field_2._M_local_buf[0xb]);
  if (bVar2) {
    IVar3 = GetShaderTypePipelineIndex(_msg.field_2._12_4_,_msg.field_2._M_local_buf[0xb]);
    pvVar7 = std::array<signed_char,_6UL>::operator[](&this->m_ActiveShaderStageIndex,(long)IVar3);
    uVar4 = (uint)*pvVar7;
    if ((int)uVar4 < 0) {
      this_local._4_4_ = 0;
    }
    else {
      msg.field_2._12_4_ = uVar4;
      UVar5 = GetNumShaders(this);
      if (UVar5 <= uVar4) {
        FormatString<char[26],char[46]>
                  ((string *)local_88,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"static_cast<Uint32>(MgrInd) < GetNumShaders()",
                   (char (*) [46])(ulong)UVar5);
        Message = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (Message,"GetVariableCount",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceBindingBase.hpp"
                   ,0xd7);
        std::__cxx11::string::~string((string *)local_88);
      }
      this_local._4_4_ =
           ShaderVariableManagerGL::GetVariableCount
                     (this->m_pShaderVarMgrs + (int)msg.field_2._12_4_);
    }
  }
  else {
    local_48 = GetShaderTypeLiteralName(_msg.field_2._12_4_);
    local_50 = GetPipelineTypeString(_msg.field_2._M_local_buf[0xb]);
    this_00 = RefCntAutoPtr<Diligent::PipelineResourceSignatureGLImpl>::operator->(&this->m_pPRS);
    Args_4 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
                        *)this_00);
    FormatString<char[71],char_const*,char[30],char_const*,char[31],char_const*,char[3]>
              ((string *)local_40,
               (Diligent *)"Unable to get the number of mutable/dynamic variables in shader stage ",
               (char (*) [71])&local_48,(char **)" as the stage is invalid for ",
               (char (*) [30])&local_50,(char **)0x48a6bc,(char (*) [31])Args_4,(char **)"\'.",
               in_stack_ffffffffffffff58);
    puVar1 = DebugMessageCallback;
    if (DebugMessageCallback != (undefined *)0x0) {
      uVar6 = std::__cxx11::string::c_str();
      (*(code *)puVar1)(1,uVar6,0);
    }
    std::__cxx11::string::~string((string *)local_40);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

GetVariableCount(SHADER_TYPE ShaderType) const override final
    {
        const PIPELINE_TYPE PipelineType = GetPipelineType();
        if (!IsConsistentShaderType(ShaderType, PipelineType))
        {
            LOG_WARNING_MESSAGE("Unable to get the number of mutable/dynamic variables in shader stage ", GetShaderTypeLiteralName(ShaderType),
                                " as the stage is invalid for ", GetPipelineTypeString(PipelineType), " pipeline resource signature '", m_pPRS->GetDesc().Name, "'.");
            return 0;
        }

        const Int32 ShaderInd = GetShaderTypePipelineIndex(ShaderType, PipelineType);
        const int   MgrInd    = m_ActiveShaderStageIndex[ShaderInd];
        if (MgrInd < 0)
            return 0;

        VERIFY_EXPR(static_cast<Uint32>(MgrInd) < GetNumShaders());
        return m_pShaderVarMgrs[MgrInd].GetVariableCount();
    }